

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void burstsort2_sampling_vector_block(uchar **strings,size_t n)

{
  ostream *poVar1;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *node;
  undefined8 *puVar2;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *pTVar3;
  pointer ppvVar4;
  vector_block<unsigned_char_*,_128U> *this;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *pTVar5;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  byte *pbVar9;
  _func_void_uchar_ptr_ptr_int_int *p_Var10;
  uint uVar11;
  size_t depth;
  byte bVar12;
  ulong uVar13;
  uchar *str;
  BurstSimple<unsigned_char> local_51;
  ulong local_50;
  uchar **local_48;
  size_t local_40;
  byte *local_38;
  
  local_48 = strings;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"pseudo_sample",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(): sampling ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," strings ...\n",0xd);
  node = (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *)operator_new(0x18);
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = n;
  if (n != 0) {
    lVar7 = 5000;
    local_50 = 0;
    do {
      pbVar9 = local_48[local_50];
      pTVar3 = node;
      if (pbVar9 == (byte *)0x0) goto LAB_00211014;
      while( true ) {
        bVar12 = *pbVar9;
        if (bVar12 == 0) break;
        ppvVar4 = (pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = (long)(pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3;
        if (uVar6 < (ulong)bVar12 + 1) {
          std::vector<void_*,_std::allocator<void_*>_>::resize(&pTVar3->_buckets,(ulong)bVar12 + 1);
          ppvVar4 = (pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = (long)(pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3;
        }
        uVar11 = (uint)bVar12;
        uVar13 = (ulong)uVar11;
        if ((uVar6 <= uVar13) || (((ulong)ppvVar4[uVar13] & 1) == 0)) {
          puVar2 = (undefined8 *)operator_new(0x18);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2[2] = 0;
          *(undefined8 **)
           ((long)(pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + (ulong)(uVar11 * 8)) = puVar2;
          ppvVar4 = (pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = *(ulong *)((long)ppvVar4 + (ulong)(uVar11 * 8));
          if (uVar6 == 0) goto LAB_00211052;
          ppvVar4[uVar13] = (void *)(uVar6 | 1);
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) goto LAB_00210ecf;
        }
        pTVar3 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_node
                           (pTVar3,uVar11);
        pbVar9 = pbVar9 + 1;
        if (pTVar3 == (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xd9,
                        "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = vector_block<unsigned char *, 128>]"
                       );
        }
      }
      local_50 = local_50 + 0x2000;
    } while (local_50 < local_40);
LAB_00210ecf:
    sVar8 = 0;
    do {
      local_38 = local_48[sVar8];
      if (local_38 == (byte *)0x0) {
LAB_00211014:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar12 = *local_38;
      p_Var10 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar12;
      uVar11 = (uint)bVar12;
      ppvVar4 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
               ((long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3);
      depth = 1;
      pTVar3 = node;
      if (p_Var10 < in_RCX) {
        lVar7 = 0;
        do {
          if (((ulong)ppvVar4[(long)p_Var10] & 1) == 0) break;
          if (bVar12 == 0) {
            __assert_fail("not is_end(c)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xeb,
                          "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                         );
          }
          pTVar3 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_node
                             (pTVar3,(uint)p_Var10);
          if (local_38 == (byte *)0x0) goto LAB_00211014;
          bVar12 = local_38[lVar7 + 1];
          lVar7 = lVar7 + 1;
          p_Var10 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar12;
          ppvVar4 = (pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)(pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3);
        } while (p_Var10 < in_RCX);
        uVar11 = (uint)p_Var10;
        depth = lVar7 + 1;
      }
      this = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                       (pTVar3,uVar11);
      if (this == (vector_block<unsigned_char_*,_128U> *)0x0) {
        __assert_fail("bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xf1,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      vector_block<unsigned_char_*,_128U>::push_back(this,&local_38);
      if ((bVar12 != 0) &&
         (in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)this->_left_in_block,
         0x4000 < (ulong)(((long)(this->_index_block).
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_index_block).
                                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                ._M_impl.super__Vector_impl_data._M_start) * 0x10 - (long)in_RCX)))
      {
        pTVar5 = BurstSimple<unsigned_char>::operator()(&local_51,this,depth);
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar12;
        *(TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> **)
         ((long)(pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + (ulong)((uint)bVar12 * 8)) = pTVar5;
        ppvVar4 = (pTVar3->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = *(ulong *)((long)ppvVar4 + (ulong)((uint)bVar12 * 8));
        if (uVar6 == 0) {
LAB_00211052:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x5c,"void make_trie(void *&)");
        }
        ppvVar4[(long)in_RCX] = (void *)(uVar6 | 1);
        vector_block<unsigned_char_*,_128U>::~vector_block(this);
        operator_delete(this);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != local_40);
  }
  traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_char>
            (node,local_48,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_vector_block(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}